

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

int32 swap_check(FILE *fp)

{
  int32 iVar1;
  uint uVar2;
  int32 local_20;
  uint local_1c;
  uint32 ret;
  uint32 magic;
  FILE *fp_local;
  
  _ret = fp;
  iVar1 = fread_retry(&local_1c,4,1,fp);
  if (iVar1 == 1) {
    if (local_1c == 0x11223344) {
      local_20 = 0;
    }
    else {
      uVar2 = local_1c >> 8 & 0xff00;
      if ((local_1c >> 0x18 | uVar2 | (local_1c & 0xff00) << 8 | local_1c << 0x18) == 0x11223344) {
        local_20 = 1;
      }
      else {
        local_1c = local_1c & 0xffff | uVar2 << 8 | (local_1c >> 0x18) << 0x18;
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/swap.c"
                ,0x61,
                "Expected to read 0x%x (or byte permuted) byte order indicator.  Instead read 0x%x\n"
                ,0x11223344);
        local_20 = -1;
      }
    }
    fp_local._4_4_ = local_20;
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/swap.c"
            ,0x4f,"error while reading bo_magic\n");
    fp_local._4_4_ = -1;
  }
  return fp_local._4_4_;
}

Assistant:

static int32
swap_check(FILE * fp)
{
    uint32 magic;

    if (fread(&magic, sizeof(uint32), 1, fp) != 1) {
        E_ERROR("Cannot read BYTEORDER MAGIC NO.\n");
        return -1;
    }

    if (magic != BYTE_ORDER_MAGIC) {
        /* either need to swap or got bogus magic number */
        SWAP_INT32(&magic);

        if (magic == BYTE_ORDER_MAGIC)
            return 1;

        SWAP_INT32(&magic);
        E_ERROR("Bad BYTEORDER MAGIC NO: %08x, expecting %08x\n",
                magic, BYTE_ORDER_MAGIC);
        return -1;
    }

    return 0;
}